

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_ecmult.c
# Opt level: O2

void bench_ecmult_0p_g(void *arg,int iters)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  uVar1 = (ulong)(uint)iters;
  if (iters < 1) {
    uVar1 = uVar2;
  }
  for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
    secp256k1_ecmult((secp256k1_gej *)(*(long *)((long)arg + 0x60) + uVar2),(secp256k1_gej *)0x0,
                     &secp256k1_scalar_zero,
                     (secp256k1_scalar *)
                     ((ulong)((*(int *)((long)arg + 0x50) + (int)uVar3 & 0x7fffU) << 5) +
                     *(long *)((long)arg + 0x10)));
    uVar2 = uVar2 + 0x80;
  }
  return;
}

Assistant:

static void bench_ecmult_0p_g(void* arg, int iters) {
    bench_data* data = (bench_data*)arg;
    int i;

    for (i = 0; i < iters; ++i) {
        secp256k1_ecmult(&data->output[i], NULL, &secp256k1_scalar_zero, &data->scalars[(data->offset1+i) % POINTS]);
    }
}